

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::to_func_call_arg_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,Parameter *param_1,uint32_t id)

{
  uint32_t uVar1;
  Variant *pVVar2;
  ulong uVar3;
  SPIRVariable *pSVar4;
  
  uVar3 = (ulong)id;
  if ((uVar3 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar2 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
     pVVar2[uVar3].type == TypeVariable)) {
    pSVar4 = Variant::get<spirv_cross::SPIRVariable>(pVVar2 + uVar3);
  }
  else {
    pSVar4 = (SPIRVariable *)0x0;
  }
  if ((pSVar4 != (SPIRVariable *)0x0) && (uVar1 = (pSVar4->basevariable).id, uVar1 != 0)) {
    id = uVar1;
  }
  to_expression_abi_cxx11_(__return_storage_ptr__,this,id,true);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_func_call_arg(const SPIRFunction::Parameter &, uint32_t id)
{
	// Make sure that we use the name of the original variable, and not the parameter alias.
	uint32_t name_id = id;
	auto *var = maybe_get<SPIRVariable>(id);
	if (var && var->basevariable)
		name_id = var->basevariable;
	return to_expression(name_id);
}